

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowSetMarkA_rec(Aig_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  
  while( true ) {
    uVar1 = *(ulong *)&pObj->field_0x18;
    if (((uVar1 & 0x10) != 0) ||
       (*(ulong *)&pObj->field_0x18 = uVar1 | 0x10, ((uint)uVar1 & 7) == 2)) {
      return;
    }
    iVar2 = Aig_ObjIsConst1(pObj);
    if (iVar2 != 0) {
      return;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) break;
    Llb_ManFlowSetMarkA_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x3a8,"void Llb_ManFlowSetMarkA_rec(Aig_Obj_t *)");
}

Assistant:

void Llb_ManFlowSetMarkA_rec( Aig_Obj_t * pObj )
{
    if ( pObj->fMarkA )
        return;
    pObj->fMarkA = 1;
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowSetMarkA_rec( Aig_ObjFanin0(pObj) );
    Llb_ManFlowSetMarkA_rec( Aig_ObjFanin1(pObj) );
}